

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::edit_distance::anon_unknown_1::Hunk::Hunk
          (Hunk *this,size_t left_start,size_t right_start)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::list((list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *)
         0x1e44cf);
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::list((list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *)
         0x1e44dd);
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::list((list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *)
         0x1e44eb);
  return;
}

Assistant:

Hunk(size_t left_start, size_t right_start)
      : left_start_(left_start),
        right_start_(right_start),
        adds_(),
        removes_(),
        common_() {}